

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

ValueEntry * __thiscall rsg::ValueScope::allocate(ValueScope *this,Variable *variable)

{
  pointer *pppVVar1;
  iterator __position;
  ValueEntry *pVVar2;
  ValueEntry *entry;
  ValueEntry *local_20;
  
  pVVar2 = (ValueEntry *)operator_new(0x88);
  pVVar2->m_variable = variable;
  ValueRange::ValueRange(&pVVar2->m_valueRange,&variable->m_type);
  __position._M_current =
       (this->m_entries).super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_20 = pVVar2;
  if (__position._M_current ==
      (this->m_entries).super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>>::
    _M_realloc_insert<rsg::ValueEntry*const&>
              ((vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>> *)this,__position,
               &local_20);
  }
  else {
    *__position._M_current = pVVar2;
    pppVVar1 = &(this->m_entries).
                super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  return local_20;
}

Assistant:

ValueEntry* ValueScope::allocate (const Variable* variable)
{
	ValueEntry* entry = new ValueEntry(variable);
	try
	{
		m_entries.push_back(entry);
		return entry;
	}
	catch (const std::exception&)
	{
		delete entry;
		throw;
	}
}